

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

void cp_line(CPState *cp,BCLine hashline)

{
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar1;
  int iVar2;
  
  aVar1 = (cp->val).field_0;
  iVar2 = cp->tok;
  while ((iVar2 != 0x103 && (cp->linenumber == hashline))) {
    cp_next(cp);
    iVar2 = cp->tok;
  }
  cp->linenumber = (BCLine)aVar1;
  return;
}

Assistant:

static void cp_line(CPState *cp, BCLine hashline)
{
  BCLine newline = cp->val.u32;
  /* TODO: Handle file name and include it in error messages. */
  while (cp->tok != CTOK_EOF && cp->linenumber == hashline)
    cp_next(cp);
  cp->linenumber = newline;
}